

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_xml.c
# Opt level: O3

int xml_print_data(lyout *out,lyd_node *root,int options)

{
  LYS_NODE LVar1;
  uint uVar2;
  int iVar3;
  int *piVar4;
  lys_node *node;
  lyd_node *plVar5;
  ulong uVar6;
  char *pcVar7;
  uint level;
  lyd_node *plVar8;
  bool bVar9;
  bool bVar10;
  
  piVar4 = __errno_location();
  *piVar4 = 0;
  if (root == (lyd_node *)0x0) {
    if ((out->type & ~LYOUT_STREAM) == LYOUT_MEMORY) {
      ly_print(out,"");
    }
    goto LAB_00194b62;
  }
  uVar2 = options & 2;
  level = uVar2 >> 1;
  bVar9 = true;
  if (((uint)options >> 8 & 1) == 0) goto LAB_00194af9;
  plVar5 = root;
  if (root->schema->nodetype != LYS_RPC) {
    LVar1 = root->schema->nodetype;
    while (LVar1 != LYS_ACTION) {
      if (((LVar1 & (LYS_ANYDATA|LYS_LEAFLIST|LYS_LEAF)) != LYS_UNKNOWN) ||
         (plVar8 = plVar5->child, plVar8 == (lyd_node *)0x0)) {
        if (plVar5 == root) {
          if ((LVar1 & (LYS_ACTION|LYS_RPC|LYS_NOTIF|LYS_LIST|LYS_CONTAINER)) == LYS_UNKNOWN)
          goto LAB_00194aa7;
          break;
        }
        plVar8 = plVar5->next;
        if (plVar8 == (lyd_node *)0x0) {
          plVar5 = plVar5->parent;
          do {
            if (plVar5->parent == root->parent) goto LAB_00194a9d;
            plVar8 = plVar5->next;
            plVar5 = plVar5->parent;
          } while (plVar8 == (lyd_node *)0x0);
        }
      }
      plVar5 = plVar8;
      LVar1 = plVar8->schema->nodetype;
    }
  }
  if (plVar5->child == (lyd_node *)0x0) {
LAB_00194aa7:
    bVar9 = true;
    if (plVar5->schema->nodetype == LYS_ACTION) {
      pcVar7 = "\n";
      if (uVar2 == 0) {
        pcVar7 = "";
      }
      bVar9 = false;
      ly_print(out,"%*s<action xmlns=\"urn:ietf:params:xml:ns:yang:1\">%s",0,"",pcVar7);
      level = uVar2;
    }
  }
  else {
    node = plVar5->child->schema;
    do {
      node = lys_parent(node);
      if (node == (lys_node *)0x0) goto LAB_00194aa7;
    } while (node->nodetype == LYS_USES);
    if (node->nodetype != LYS_OUTPUT) goto LAB_00194aa7;
    root = plVar5->child;
LAB_00194a9d:
    bVar9 = true;
  }
  for (; root != (lyd_node *)0x0; root = root->next) {
LAB_00194af9:
    iVar3 = xml_print_node(out,level,root,1,options);
    if (iVar3 != 0) {
      return 1;
    }
    if ((options & 1U) == 0) break;
  }
  if (!bVar9) {
    bVar9 = level == 0;
    iVar3 = level - 1;
    bVar10 = iVar3 == 0;
    if (bVar9) {
      iVar3 = 0;
    }
    uVar6 = (ulong)(iVar3 * 2 - 2);
    if (bVar9 || bVar10) {
      uVar6 = 0;
    }
    pcVar7 = "\n";
    if (bVar9 || bVar10) {
      pcVar7 = "";
    }
    ly_print(out,"%*s</action>%s",uVar6,"",pcVar7);
  }
LAB_00194b62:
  ly_print_flush(out);
  iVar3 = *piVar4;
  if (iVar3 != 0) {
    pcVar7 = strerror(iVar3);
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_ESYS,"Print error (%s).",pcVar7);
  }
  return (uint)(iVar3 != 0);
}

Assistant:

int
xml_print_data(struct lyout *out, const struct lyd_node *root, int options)
{
    const struct lyd_node *node, *next;
    struct lys_node *parent = NULL;
    int level, action_input = 0;

    LY_PRINT_SET;

    if (!root) {
        if (out->type == LYOUT_MEMORY || out->type == LYOUT_CALLBACK) {
            ly_print(out, "");
        }
        goto finish;
    }

    level = (options & LYP_FORMAT ? 1 : 0);

    if (options & LYP_NETCONF) {
        if (root->schema->nodetype != LYS_RPC) {
            /* learn whether we are printing an action */
            LY_TREE_DFS_BEGIN(root, next, node) {
                if (node->schema->nodetype == LYS_ACTION) {
                    break;
                }
                LY_TREE_DFS_END(root, next, node);
            }
        } else {
            node = root;
        }

        if (node) {
            if ((node->schema->nodetype & (LYS_LIST | LYS_CONTAINER | LYS_RPC | LYS_NOTIF | LYS_ACTION)) && node->child) {
                for (parent = lys_parent(node->child->schema); parent && (parent->nodetype == LYS_USES); parent = lys_parent(parent));
            }
            if (parent && (parent->nodetype == LYS_OUTPUT)) {
                /* rpc/action output - skip the container */
                root = node->child;
            } else if (node->schema->nodetype == LYS_ACTION) {
                /* action input - print top-level action element */
                action_input = 1;
            }
        }
    }

    if (action_input) {
        ly_print(out, "%*s<action xmlns=\"urn:ietf:params:xml:ns:yang:1\">%s", LEVEL, INDENT, level ? "\n" : "");
        if (level) {
            ++level;
        }
    }

    /* content */
    LY_TREE_FOR(root, node) {
        if (xml_print_node(out, level, node, 1, options)) {
            return EXIT_FAILURE;
        }
        if (!(options & LYP_WITHSIBLINGS)) {
            break;
        }
    }

    if (action_input) {
        if (level) {
            --level;
        }
        ly_print(out, "%*s</action>%s", LEVEL, INDENT, level ? "\n" : "");
    }

finish:
    ly_print_flush(out);

    LY_PRINT_RET(NULL);
}